

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Vec_Ptr_t * Aig_ManRegPartitionTraverse(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *vLos;
  int iVar3;
  int i;
  int iVar4;
  
  for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar3);
    *(int *)((long)pvVar2 + 0x28) = iVar3;
  }
  vLos = Vec_PtrAlloc(p->nRegs);
  Aig_ManIncrementTravId(p);
  iVar3 = 1;
  iVar4 = 0;
  for (i = p->nObjs[3] - p->nRegs; i < p->vCos->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,i);
    printf("Latch %d: ",iVar3);
    Aig_ManRegPartitionTraverse_rec
              (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),vLos);
    iVar1 = vLos->nSize;
    printf("%d=%d \n",iVar3,(ulong)(uint)(iVar1 - iVar4));
    iVar3 = iVar3 + 1;
    iVar4 = iVar1;
  }
  printf("Total collected = %d. Total regs = %d.\n",(ulong)(uint)vLos->nSize,(ulong)(uint)p->nRegs);
  return vLos;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionTraverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vLos;
    Aig_Obj_t * pObj;
    int i, nPrev, Counter;
    // mark the registers
    Aig_ManForEachCi( p, pObj, i )
       pObj->iData = i; 
    // collect registers
    vLos = Vec_PtrAlloc( Aig_ManRegNum(p) );
    nPrev = 0;
    Counter = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        ++Counter;
        printf( "Latch %d: ", Counter );
        Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
printf( "%d=%d \n", Counter, Vec_PtrSize(vLos)-nPrev );
        nPrev = Vec_PtrSize(vLos);
    }
    printf( "Total collected = %d. Total regs = %d.\n", Vec_PtrSize(vLos), Aig_ManRegNum(p) );
    return vLos;
}